

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

Array<asl::Var> * __thiscall asl::Array<asl::Var>::resize(Array<asl::Var> *this,int m)

{
  Type TVar1;
  
  TVar1 = this->_a[-1]._type;
  reserve(this,m);
  if ((int)TVar1 < m) {
    asl_construct<asl::Var>(this->_a + (int)TVar1,m - TVar1);
  }
  else if (m < (int)TVar1) {
    asl_destroy<asl::Var>(this->_a + m,TVar1 - m);
  }
  this->_a[-1]._type = m;
  return this;
}

Assistant:

Array& resize(int m)
	{
		int n = d().n;
		reserve(m);
		if (m > n)
			asl_construct(_a + n, m - n);
		else if (m < n)
			asl_destroy(_a + m, n - m);
		d().n = m;
		return *this;
	}